

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void set_early_term_based_on_uv_plane
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MACROBLOCKD *xd,int mi_row,int mi_col,
               int *early_term,int num_blk,uint *sse_tx,uint *var_tx,int sum,uint var,uint sse)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  BLOCK_SIZE BVar6;
  sbyte sVar7;
  sbyte sVar8;
  int iVar9;
  uint uVar10;
  uint plane_to;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  long lVar14;
  long lVar15;
  long in_RCX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long *in_RDI;
  undefined4 *in_stack_00000008;
  int64_t uv_ac_thr;
  int64_t uv_dc_thr;
  long in_stack_00000020;
  int shift_dc;
  int shift_ac;
  BLOCK_SIZE uv_bsize;
  macroblockd_plane *puvd;
  macroblock_plane *puv;
  int j;
  int plane;
  uint sse_uv [2];
  uint var_uv [2];
  int skip_uv [2];
  int k;
  int norm_sum;
  int dc_test;
  int ac_test;
  int bh;
  int bw;
  int64_t ac_thr;
  int64_t dc_thr;
  uint32_t ac_quant;
  uint32_t dc_quant;
  macroblock_plane *p;
  AV1_COMMON *cm;
  int iVar16;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  MACROBLOCKD *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  int local_68;
  int plane_from;
  long local_50;
  
  iVar9 = (int)*(short *)(*(long *)(in_RSI + 0x80) + 2);
  uVar10 = (uint)((int)**(short **)(in_RSI + 0x80) * (int)**(short **)(in_RSI + 0x80)) >> 6;
  plane_to = (uint)""[in_DL];
  bVar5 = true;
  plane_from = 1;
  if (shift_ac < 1) {
    shift_ac = -shift_ac;
  }
  iVar11 = ac_thr_factor(*(int *)((long)in_RDI + 0x4272c),(int)in_RDI[0x77f7],
                         *(int *)((long)in_RDI + 0x3bfbc),shift_ac >> (""[in_DL] + ""[in_DL] & 0x1f)
                        );
  local_50 = (long)iVar11 * (ulong)((uint)(iVar9 * iVar9) >> 6);
  if (*(int *)((long)in_RDI + 0x60d64) != 0) {
    uVar10 = uVar10 << 1;
    local_50 = local_50 * 4;
  }
  for (local_68 = 0; local_68 < (int)uv_ac_thr; local_68 = local_68 + 1) {
    if ((local_50 <= (long)(ulong)*(uint *)(in_stack_00000020 + (long)local_68 * 4)) &&
       ((int)puvd != 0)) {
      bVar5 = false;
      break;
    }
    if ((uVar10 <= (uint)(*(int *)(uv_dc_thr + (long)local_68 * 4) -
                         *(int *)(in_stack_00000020 + (long)local_68 * 4))) &&
       ((int)puv != (int)puvd)) {
      plane_from = 0;
      break;
    }
  }
  if ((bVar5) && (plane_from != 0)) {
    memset(&stack0xffffffffffffff90,0,8);
    iVar9 = 1;
    while (iVar9 < 3) {
      iVar12 = iVar9 + -1;
      *(undefined4 *)(&stack0xffffffffffffff90 + (long)iVar12 * 4) = 1;
      iVar11 = iVar9;
      if (*(char *)(in_RSI + 0x25626 + (long)(iVar9 + -1)) != '\0') {
        *(undefined4 *)(&stack0xffffffffffffff90 + (long)iVar12 * 4) = 0;
        lVar14 = in_RSI + (long)iVar9 * 0x88;
        lVar15 = in_RCX + 0x10 + (long)iVar9 * 0xa30;
        BVar6 = get_plane_block_size(in_DL,*(int *)(lVar15 + 4),*(int *)(lVar15 + 8));
        sVar7 = 3;
        if (*(int *)((long)in_RDI + 0x60d64) != 0) {
          sVar7 = 5;
        }
        sVar8 = 3;
        if (*(int *)((long)in_RDI + 0x60d64) != 0) {
          sVar8 = 4;
        }
        sVar1 = **(short **)(lVar14 + 0x80);
        sVar2 = **(short **)(lVar14 + 0x80);
        sVar3 = *(short *)(*(long *)(lVar14 + 0x80) + 2);
        sVar4 = *(short *)(*(long *)(lVar14 + 0x80) + 2);
        iVar16 = iVar9;
        iVar11 = iVar9;
        av1_enc_build_inter_predictor
                  ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                   (BUFFER_SET *)CONCAT44(iVar9,iVar12),(BLOCK_SIZE)((ulong)lVar14 >> 0x38),
                   plane_from,plane_to);
        uVar13 = (**(code **)(*in_RDI + (ulong)BVar6 * 0x70 + 0xc918))
                           (*(undefined8 *)(lVar14 + 0x30),*(undefined4 *)(lVar14 + 0x48),
                            *(undefined8 *)(lVar15 + 0x10),*(undefined4 *)(lVar15 + 0x28),
                            &stack0xffffffffffffff80 + (long)iVar12 * 4,(long)iVar12 * 4,iVar9,
                            iVar16);
        *(undefined4 *)(&stack0xffffffffffffff88 + (long)iVar12 * 4) = uVar13;
        if ((((long)((int)sVar3 * (int)sVar4 >> sVar7) <=
              (long)(ulong)*(uint *)(&stack0xffffffffffffff88 + (long)iVar12 * 4)) &&
            (*(int *)(&stack0xffffffffffffff88 + (long)iVar12 * 4) != 0)) ||
           (((long)((int)sVar1 * (int)sVar2 >> sVar8) <=
             (long)(ulong)(uint)(*(int *)(&stack0xffffffffffffff80 + (long)iVar12 * 4) -
                                *(int *)(&stack0xffffffffffffff88 + (long)iVar12 * 4)) &&
            (*(int *)(&stack0xffffffffffffff80 + (long)iVar12 * 4) !=
             *(int *)(&stack0xffffffffffffff88 + (long)iVar12 * 4))))) break;
        *(undefined4 *)(&stack0xffffffffffffff90 + (long)iVar12 * 4) = 1;
      }
      iVar9 = iVar11 + 1;
    }
    if ((in_stack_ffffffffffffff90 & in_stack_ffffffffffffff94) != 0) {
      *in_stack_00000008 = 1;
    }
  }
  return;
}

Assistant:

static inline void set_early_term_based_on_uv_plane(
    AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, MACROBLOCKD *xd, int mi_row,
    int mi_col, int *early_term, int num_blk, const unsigned int *sse_tx,
    const unsigned int *var_tx, int sum, unsigned int var, unsigned int sse) {
  AV1_COMMON *const cm = &cpi->common;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  const uint32_t dc_quant = p->dequant_QTX[0];
  const uint32_t ac_quant = p->dequant_QTX[1];
  int64_t dc_thr = dc_quant * dc_quant >> 6;
  int64_t ac_thr = ac_quant * ac_quant >> 6;
  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  int ac_test = 1;
  int dc_test = 1;
  const int norm_sum = abs(sum) >> (bw + bh);

#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && denoise_svc(cpi) &&
      cpi->oxcf.speed > 5)
    ac_thr = av1_scale_acskip_thresh(ac_thr, cpi->denoiser.denoising_level,
                                     norm_sum, cpi->svc.temporal_layer_id);
  else
    ac_thr *= ac_thr_factor(cpi->oxcf.speed, cm->width, cm->height, norm_sum);
#else
  ac_thr *= ac_thr_factor(cpi->oxcf.speed, cm->width, cm->height, norm_sum);

#endif

  if (cpi->sf.rt_sf.increase_source_sad_thresh) {
    dc_thr = dc_thr << 1;
    ac_thr = ac_thr << 2;
  }

  for (int k = 0; k < num_blk; k++) {
    // Check if all ac coefficients can be quantized to zero.
    if (!(var_tx[k] < ac_thr || var == 0)) {
      ac_test = 0;
      break;
    }
    // Check if dc coefficient can be quantized to zero.
    if (!(sse_tx[k] - var_tx[k] < dc_thr || sse == var)) {
      dc_test = 0;
      break;
    }
  }

  // Check if chroma can be skipped based on ac and dc test flags.
  if (ac_test && dc_test) {
    int skip_uv[2] = { 0 };
    unsigned int var_uv[2];
    unsigned int sse_uv[2];
    // Transform skipping test in UV planes.
    for (int plane = AOM_PLANE_U; plane <= AOM_PLANE_V; plane++) {
      int j = plane - 1;
      skip_uv[j] = 1;
      if (x->color_sensitivity[COLOR_SENS_IDX(plane)]) {
        skip_uv[j] = 0;
        struct macroblock_plane *const puv = &x->plane[plane];
        struct macroblockd_plane *const puvd = &xd->plane[plane];
        const BLOCK_SIZE uv_bsize = get_plane_block_size(
            bsize, puvd->subsampling_x, puvd->subsampling_y);
        // Adjust these thresholds for UV.
        const int shift_ac = cpi->sf.rt_sf.increase_source_sad_thresh ? 5 : 3;
        const int shift_dc = cpi->sf.rt_sf.increase_source_sad_thresh ? 4 : 3;
        const int64_t uv_dc_thr =
            (puv->dequant_QTX[0] * puv->dequant_QTX[0]) >> shift_dc;
        const int64_t uv_ac_thr =
            (puv->dequant_QTX[1] * puv->dequant_QTX[1]) >> shift_ac;
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                      plane, plane);
        var_uv[j] = cpi->ppi->fn_ptr[uv_bsize].vf(puv->src.buf, puv->src.stride,
                                                  puvd->dst.buf,
                                                  puvd->dst.stride, &sse_uv[j]);
        if ((var_uv[j] < uv_ac_thr || var_uv[j] == 0) &&
            (sse_uv[j] - var_uv[j] < uv_dc_thr || sse_uv[j] == var_uv[j]))
          skip_uv[j] = 1;
        else
          break;
      }
    }
    if (skip_uv[0] & skip_uv[1]) {
      *early_term = 1;
    }
  }
}